

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O3

void __thiscall
OpenMPDeviceTypeClause::generateDOT
          (OpenMPDeviceTypeClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_t sVar7;
  uint uVar8;
  long *plVar9;
  ulong *puVar10;
  size_type *psVar11;
  ulong uVar12;
  uint uVar13;
  undefined8 uVar14;
  uint uVar15;
  string __str_1;
  string node_id;
  string parameter_string;
  string __str;
  string clause_kind;
  string indent;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char *local_b8;
  undefined8 local_b0;
  char local_a8;
  undefined7 uStack_a7;
  long *local_98 [2];
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  OpenMPDeviceTypeClause *local_38;
  
  local_b8 = &local_a8;
  local_b0 = 0;
  local_a8 = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_38 = this;
  std::__cxx11::string::_M_construct((ulong)&local_d8,(char)depth);
  uVar13 = -depth;
  if (0 < depth) {
    uVar13 = depth;
  }
  uVar15 = 1;
  if (9 < uVar13) {
    uVar12 = (ulong)uVar13;
    uVar4 = 4;
    do {
      uVar15 = uVar4;
      uVar8 = (uint)uVar12;
      if (uVar8 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_0014d32a;
      }
      if (uVar8 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_0014d32a;
      }
      if (uVar8 < 10000) goto LAB_0014d32a;
      uVar12 = uVar12 / 10000;
      uVar4 = uVar15 + 4;
    } while (99999 < uVar8);
    uVar15 = uVar15 + 1;
  }
LAB_0014d32a:
  local_158 = &local_148;
  std::__cxx11::string::_M_construct((ulong)&local_158,(char)uVar15 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)depth >> 0x1f) + (long)local_158),uVar15,uVar13);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x1a5f3b);
  local_198 = &local_188;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_188 = *plVar9;
    lStack_180 = plVar5[3];
  }
  else {
    local_188 = *plVar9;
    local_198 = (long *)*plVar5;
  }
  local_190 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_168 = *puVar10;
    lStack_160 = plVar5[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar10;
    local_178 = (ulong *)*plVar5;
  }
  local_170 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar13 = -index;
  if (0 < index) {
    uVar13 = index;
  }
  uVar15 = 1;
  if (9 < uVar13) {
    uVar12 = (ulong)uVar13;
    uVar4 = 4;
    do {
      uVar15 = uVar4;
      uVar8 = (uint)uVar12;
      if (uVar8 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_0014d476;
      }
      if (uVar8 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_0014d476;
      }
      if (uVar8 < 10000) goto LAB_0014d476;
      uVar12 = uVar12 / 10000;
      uVar4 = uVar15 + 4;
    } while (99999 < uVar8);
    uVar15 = uVar15 + 1;
  }
LAB_0014d476:
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)uVar15 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1b8._M_dataplus._M_p + ((uint)index >> 0x1f),uVar15,uVar13);
  uVar12 = 0xf;
  if (local_178 != &local_168) {
    uVar12 = local_168;
  }
  if (uVar12 < local_1b8._M_string_length + local_170) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      uVar14 = local_1b8.field_2._M_allocated_capacity;
    }
    if (local_1b8._M_string_length + local_170 <= (ulong)uVar14) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_178);
      goto LAB_0014d50e;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_1b8._M_dataplus._M_p);
LAB_0014d50e:
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  psVar11 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_138.field_2._M_allocated_capacity = *psVar11;
    local_138.field_2._8_8_ = puVar6[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar11;
    local_138._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_138._M_string_length = puVar6[1];
  *puVar6 = psVar11;
  puVar6[1] = 0;
  *(undefined1 *)psVar11 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  std::operator+(&local_1b8,&local_d8,parent_node);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_148 = *plVar9;
    lStack_140 = plVar5[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *plVar9;
    local_158 = (long *)*plVar5;
  }
  local_150 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_158,(ulong)local_138._M_dataplus._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_188 = *plVar9;
    lStack_180 = plVar5[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *plVar9;
    local_198 = (long *)*plVar5;
  }
  local_190 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_168 = *puVar10;
    lStack_160 = plVar5[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar10;
    local_178 = (ulong *)*plVar5;
  }
  local_170 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_178);
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = local_b8;
  iVar2 = (int)dot_file;
  if (local_b8 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
  }
  else {
    sVar7 = strlen(local_b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar3,sVar7);
  }
  std::__cxx11::string::append((char *)&local_d8);
  local_170 = 0;
  local_168 = local_168 & 0xffffffffffffff00;
  local_178 = &local_168;
  if (((ulong)local_38->device_type_kind < 3) &&
     (std::__cxx11::string::_M_replace
                ((ulong)&local_178,0,(char *)0x0,
                 (ulong)(&DAT_001a5d60 +
                        *(int *)(&DAT_001a5d60 + (ulong)local_38->device_type_kind * 4))),
     local_170 != 0)) {
    local_198 = &local_188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_138._M_dataplus._M_p,
               local_138._M_dataplus._M_p + local_138._M_string_length);
    std::__cxx11::string::append((char *)&local_198);
    std::operator+(&local_f8,&local_d8,&local_138);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_108 = *plVar9;
      lStack_100 = plVar5[3];
      local_118 = &local_108;
    }
    else {
      local_108 = *plVar9;
      local_118 = (long *)*plVar5;
    }
    local_110 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_198);
    psVar11 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1b8.field_2._M_allocated_capacity = *psVar11;
      local_1b8.field_2._8_8_ = plVar5[3];
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar11;
      local_1b8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1b8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_148 = *plVar9;
      lStack_140 = plVar5[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *plVar9;
      local_158 = (long *)*plVar5;
    }
    local_150 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_158);
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    paVar1 = &local_f8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = local_b8;
    if (local_b8 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
    }
    else {
      sVar7 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar3,sVar7);
    }
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    std::__cxx11::string::append((char *)local_98);
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)local_98,(ulong)local_198);
    local_58 = &local_48;
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_48 = *plVar9;
      lStack_40 = plVar5[3];
    }
    else {
      local_48 = *plVar9;
      local_58 = (long *)*plVar5;
    }
    local_50 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
    local_78 = &local_68;
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_68 = *plVar9;
      lStack_60 = plVar5[3];
    }
    else {
      local_68 = *plVar9;
      local_78 = (long *)*plVar5;
    }
    local_70 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_198);
    psVar11 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_f8.field_2._M_allocated_capacity = *psVar11;
      local_f8.field_2._8_8_ = plVar5[3];
      local_f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar11;
      local_f8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_108 = *plVar9;
      lStack_100 = plVar5[3];
      local_118 = &local_108;
    }
    else {
      local_108 = *plVar9;
      local_118 = (long *)*plVar5;
    }
    local_110 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_178);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    puVar10 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1b8.field_2._M_allocated_capacity = *puVar10;
      local_1b8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar10;
      local_1b8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1b8._M_string_length = plVar5[1];
    *plVar5 = (long)puVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_148 = *plVar9;
      lStack_140 = plVar5[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *plVar9;
      local_158 = (long *)*plVar5;
    }
    local_150 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_158);
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    pcVar3 = local_b8;
    if (local_b8 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(*(long *)dot_file + -0x18) + iVar2);
    }
    else {
      sVar7 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar3,sVar7);
    }
    if (local_198 != &local_188) {
      operator_delete(local_198,local_188 + 1);
    }
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  return;
}

Assistant:

void OpenMPDeviceTypeClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "device_type_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPDeviceTypeClauseKind device_type_kind = this->getDeviceTypeClauseKind();
    std::string parameter_string;
    switch (device_type_kind) {
        case OMPC_DEVICE_TYPE_host:
            parameter_string = "host";
            break;
        case OMPC_DEVICE_TYPE_nohost:
            parameter_string = "nohost";
            break;
        case OMPC_DEVICE_TYPE_any:
            parameter_string = "any";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_kind";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
}